

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O0

Results * __thiscall
testinator::TestRegistry::RunAllTests
          (Results *__return_storage_ptr__,TestRegistry *this,RunParams *params,Outputter *outputter
          )

{
  bool bVar1;
  Outputter *local_a0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_68;
  undefined1 local_59;
  undefined1 local_58 [8];
  TestMap localMap;
  Outputter *outputter_local;
  RunParams *params_local;
  TestRegistry *this_local;
  Results *rs;
  
  localMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)outputter;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
         *)local_58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::swap((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          *)local_58,&this->m_tests);
  local_59 = 0;
  bVar1 = localMap._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  if (bVar1) {
    std::make_unique<testinator::Outputter>();
    local_a0 = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
               get(&local_68);
  }
  else {
    local_a0 = (Outputter *)localMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  RunTests(__return_storage_ptr__,this,(TestMap *)local_58,params,local_a0);
  if (bVar1) {
    std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
              (&local_68);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::swap(&this->m_tests,
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          *)local_58);
  local_59 = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Results RunAllTests(const RunParams& params = RunParams(),
                        const Outputter* outputter = nullptr)
    {
      TestMap localMap;
      localMap.swap(m_tests);
      Results rs = RunTests(
          localMap,
          params,
          outputter != nullptr ? outputter : std::make_unique<Outputter>().get());
      m_tests.swap(localMap);
      return rs;
    }